

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

string * __thiscall
ast::RangeExpr::toString_abi_cxx11_(string *__return_storage_ptr__,RangeExpr *this)

{
  ostringstream msg;
  string sStack_1a8;
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__cxx11::to_string(&sStack_1a8,this->init_value);
  std::operator<<((ostream *)local_188,(string *)&sStack_1a8);
  std::__cxx11::string::~string((string *)&sStack_1a8);
  std::operator<<((ostream *)local_188,"..");
  std::__cxx11::to_string(&sStack_1a8,this->end_value);
  std::operator<<((ostream *)local_188,(string *)&sStack_1a8);
  std::__cxx11::string::~string((string *)&sStack_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::RangeExpr::toString() const {
    std::ostringstream msg;
    msg << std::to_string(init_value);
    msg << "..";
    msg << std::to_string(end_value);
    return msg.str();
}